

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O3

void dynet::TensorTools::accumulate_dev<dynet::Device_CPU>(Device_CPU *dev,Tensor *v,Tensor *v_src)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  type local_48;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_38;
  type local_28;
  
  uVar3 = (ulong)(v_src->d).nd;
  iVar1 = 1;
  iVar2 = 1;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      iVar2 = iVar2 * (v_src->d).d[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  local_28.m_rhs_xpr.m_data = v_src->v;
  local_48.m_data = v->v;
  uVar3 = (ulong)(v->d).nd;
  if (uVar3 != 0) {
    iVar1 = 1;
    uVar4 = 0;
    do {
      iVar1 = iVar1 * (v->d).d[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  local_38.m_lhs_xpr = &local_48;
  local_28.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = (v_src->d).bd * iVar2;
  local_28.m_rhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_48.m_dimensions.super_array<long,_1>._M_elems[0]._0_4_ = iVar1 * (v->d).bd;
  local_48.m_dimensions.super_array<long,_1>._M_elems[0]._4_4_ = 0;
  local_38.m_rhs_xpr = &local_28;
  local_28.m_lhs_xpr.m_data = local_48.m_data;
  local_28.m_lhs_xpr.m_dimensions.super_array<long,_1>._M_elems[0] =
       local_48.m_dimensions.super_array<long,_1>._M_elems[0];
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run(&local_38,dev->edevice);
  return;
}

Assistant:

void TensorTools::accumulate_dev(const MyDevice & dev, Tensor& v, const Tensor& v_src) {
  DYNET_ASSERT(v.d.size() == v_src.d.size(), "TensorTools::accumulate can only be used with tensors of identical size");
  v.tvec().device(*dev.edevice) += v_src.tvec();
}